

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

void __thiscall State::AddIn(State *this,Edge *edge,StringPiece path,uint64_t slash_bits)

{
  Node *node;
  Node *local_18;
  
  local_18 = GetNode(this,path,slash_bits);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&edge->inputs_,&local_18);
  Node::AddOutEdge(local_18,edge);
  return;
}

Assistant:

void State::AddIn(Edge* edge, StringPiece path, uint64_t slash_bits) {
  Node* node = GetNode(path, slash_bits);
  edge->inputs_.push_back(node);
  node->AddOutEdge(edge);
}